

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldBasePrimitiveTest_Arena_Test::TestBody
          (MapFieldBasePrimitiveTest_Arena_Test *this)

{
  TypeDefinedMapFieldBase<int,_int> *this_00;
  Map<int,_int> *this_01;
  int *piVar1;
  MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,_int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
  *this_02;
  RepeatedPtrFieldBase *pRVar2;
  pointer *__ptr;
  char *message;
  char *in_R9;
  AssertHelper local_148;
  AssertHelper local_140;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  vector<char,_std::allocator<char>_> arena_block;
  Arena arena;
  ArenaOptions local_48;
  
  std::vector<char,_std::allocator<char>_>::vector(&arena_block,0x20000,(allocator_type *)&arena);
  local_48.start_block_size = 0x100;
  local_48.max_block_size = 0x8000;
  local_48.block_alloc = (_func_void_ptr_size_t *)0x0;
  local_48.block_dealloc = (_func_void_void_ptr_size_t *)0x0;
  local_48.initial_block =
       arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_48.initial_block_size =
       (long)arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)arena_block.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  Arena::Arena(&arena,&local_48);
  this_00 = &Arena::
             DoCreateMessage<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,int,int,(google::protobuf::internal::WireFormatLite::FieldType)5,(google::protobuf::internal::WireFormatLite::FieldType)5>>
                       (&arena)->super_TypeDefinedMapFieldBase<int,_int>;
  this_01 = TypeDefinedMapFieldBase<int,_int>::MutableMap(this_00);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  piVar1 = Map<int,_int>::operator[]<int>(this_01,(key_arg<int> *)&gtest_ar);
  *piVar1 = 0x65;
  MapFieldBase::GetRepeatedField(&this_00->super_MapFieldBase);
  this_02 = Arena::
            DoCreateMessage<google::protobuf::internal::MapField<proto2_unittest::TestMap_MapInt32Int32Entry_DoNotUse,int,int,(google::protobuf::internal::WireFormatLite::FieldType)5,(google::protobuf::internal::WireFormatLite::FieldType)5>>
                      (&arena);
  pRVar2 = MapFieldBase::MutableRepeatedField((MapFieldBase *)this_02);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = pRVar2 != (RepeatedPtrFieldBase *)0x0;
  if (pRVar2 == (RepeatedPtrFieldBase *)0x0) {
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"map_field->MutableRepeatedField() != nullptr","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field_test.cc"
               ,0x9a,(char *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_));
    testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (local_148.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_148.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  pRVar2 = MapFieldBase::GetRepeatedField((MapFieldBase *)this_02);
  gtest_ar_._0_8_ = pRVar2->arena_;
  local_148.data_ = (AssertHelperData *)&arena;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            ((internal *)&gtest_ar,"MapFieldTestPeer::GetArena(map_field->GetRepeatedField())",
             "&arena",(Arena **)&gtest_ar_,(Arena **)&local_148);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field_test.cc"
               ,0x9d,message);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&arena_block.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

TEST_P(MapFieldBasePrimitiveTest, Arena) {
  // Allocate a large initial block to avoid mallocs during hooked test.
  std::vector<char> arena_block(128 * 1024);
  ArenaOptions options;
  options.initial_block = &arena_block[0];
  options.initial_block_size = arena_block.size();
  Arena arena(options);

  {
    // TODO: Re-write the test to ensure the memory for the map and
    // repeated fields are allocated from arenas.
    // NoHeapChecker no_heap;

    MapFieldType* map_field = Arena::Create<MapFieldType>(&arena);

    // Set content in map
    (*map_field->MutableMap())[100] = 101;

    // Trigger conversion to repeated field.
    map_field->GetRepeatedField();
  }

  {
    // TODO: Re-write the test to ensure the memory for the map and
    // repeated fields are allocated from arenas.
    // NoHeapChecker no_heap;

    TestMapField* map_field = Arena::Create<TestMapField>(&arena);

    // Trigger conversion to repeated field.
    EXPECT_TRUE(map_field->MutableRepeatedField() != nullptr);

    EXPECT_EQ(MapFieldTestPeer::GetArena(map_field->GetRepeatedField()),
              &arena);
  }
}